

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool validate_get_msurf_descriptors
               (_func_void_integral_image_ptr_interest_point_ptr *original_function,
               vector<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
               *test_functions,integral_image *iimage,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points)

{
  undefined8 uVar1;
  ulong uVar2;
  bool bVar3;
  byte bVar4;
  int i;
  pointer pp_Var5;
  pointer piVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  vector<interest_point,_std::allocator<interest_point>_> original_interest_points;
  interest_point test_ipoint;
  interest_point ref_ipoint;
  vector<interest_point,_std::allocator<interest_point>_> local_270;
  interest_point local_258;
  interest_point local_144;
  
  std::vector<interest_point,_std::allocator<interest_point>_>::vector(&local_270,interest_points);
  piVar6 = (interest_points->super__Vector_base<interest_point,_std::allocator<interest_point>_>).
           _M_impl.super__Vector_impl_data._M_start;
  bVar3 = true;
  if (0x32 < (ulong)(((long)(interest_points->
                            super__Vector_base<interest_point,_std::allocator<interest_point>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2) *
                    -0xed7303b5cc0ed73)) {
    uVar9 = 0x32;
    do {
      memcpy(&local_144,piVar6 + uVar9,0x114);
      (*original_function)(iimage,&local_144);
      pp_Var5 = (test_functions->
                super__Vector_base<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((test_functions->
          super__Vector_base<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
          )._M_impl.super__Vector_impl_data._M_finish != pp_Var5) {
        uVar7 = 0;
        do {
          piVar6 = (interest_points->
                   super__Vector_base<interest_point,_std::allocator<interest_point>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar2 = ((long)(interest_points->
                         super__Vector_base<interest_point,_std::allocator<interest_point>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2) *
                  -0xed7303b5cc0ed73;
          if (uVar2 < uVar9 || uVar2 - uVar9 == 0) {
            uVar1 = std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar9);
            if (local_270.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_270.
                              super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_270.
                                    super__Vector_base<interest_point,_std::allocator<interest_point>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_270.
                                    super__Vector_base<interest_point,_std::allocator<interest_point>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            _Unwind_Resume(uVar1);
          }
          memcpy(&local_258,piVar6 + uVar9,0x114);
          (*pp_Var5[uVar7])(iimage,&local_258);
          uVar2 = 0;
          iVar8 = 0;
          do {
            auVar10._8_4_ = 0x7fffffff;
            auVar10._0_8_ = 0x7fffffff7fffffff;
            auVar10._12_4_ = 0x7fffffff;
            auVar10 = vandps_avx512vl(ZEXT416((uint)(local_144.descriptor[uVar2] -
                                                    local_258.descriptor[uVar2])),auVar10);
            if (0.001 < auVar10._0_4_) {
              printf("DIFFERENCE: (%i) original: %f, optimized: %f\n",
                     (double)local_144.descriptor[uVar2],(double)local_258.descriptor[uVar2],
                     uVar2 & 0xffffffff);
              if (7 < iVar8) goto LAB_00191622;
              iVar8 = iVar8 + 1;
            }
            uVar2 = uVar2 + 1;
          } while (uVar2 != 0x40);
          if (iVar8 == 0) {
            bVar4 = 1;
          }
          else {
LAB_00191622:
            bVar4 = 0;
            printf("ERROR: MSURF descriptor test function %d does not match original function\n",
                   uVar7 & 0xffffffff);
          }
          bVar3 = (bool)(bVar3 & bVar4);
          uVar7 = uVar7 + 1;
          pp_Var5 = (test_functions->
                    super__Vector_base<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar7 < (ulong)((long)(test_functions->
                                       super__Vector_base<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var5
                                >> 3));
      }
      uVar9 = uVar9 + 1;
      piVar6 = (interest_points->super__Vector_base<interest_point,_std::allocator<interest_point>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(interest_points->
                     super__Vector_base<interest_point,_std::allocator<interest_point>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar6 >> 2) * -0xed7303b5cc0ed73;
    } while (uVar9 <= uVar7 && uVar7 - uVar9 != 0);
  }
  if (local_270.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_270.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_270.
                          super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_270.
                          super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool validate_get_msurf_descriptors(
    void (*original_function)(struct integral_image *, struct interest_point *),
    const std::vector<void (*)(struct integral_image *, struct interest_point *)> &test_functions,
    struct integral_image *iimage, const std::vector<struct interest_point> *interest_points) {
    // Copying over interest points to new vector
    std::vector<struct interest_point> original_interest_points = *interest_points;

    bool all_valid = true;

    for (int i = 50; i < interest_points->size(); ++i) { 

        struct interest_point ref_ipoint = interest_points->at(i);
        original_function(iimage, &ref_ipoint);

        bool valid = true;
        for (int j = 0; j < test_functions.size(); ++j) {
            struct interest_point test_ipoint = interest_points->at(i);

            test_functions[j](iimage, &test_ipoint);

            bool valid = compare_arrays_close(ref_ipoint.descriptor, test_ipoint.descriptor, 64, VALIDATION_PRECISION);
            if (!valid) {
                printf("ERROR: MSURF descriptor test function %d does not match original function\n", j);
            }

            // Updating flag indicating if all functions are valid
            all_valid &= valid;
        }
    }

    return all_valid;
}